

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O2

void __thiscall PrintLanguage::pushAtom(PrintLanguage *this,Atom *atom)

{
  EmitXml *pEVar1;
  pointer pRVar2;
  int iVar3;
  pointer pRVar4;
  
  if ((ulong)(long)this->pending <
      (ulong)(((long)(this->nodepend).
                     super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodepend).
                    super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    recurse(this);
  }
  pRVar4 = (this->revpol).
           super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->revpol).
      super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
      ._M_impl.super__Vector_impl_data._M_start != pRVar4) {
    emitOp(this,pRVar4 + -1);
    emitAtom(this,atom);
    pRVar4 = (this->revpol).
             super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      iVar3 = pRVar4[-1].visited + 1;
      pRVar4[-1].visited = iVar3;
      if (iVar3 != (pRVar4[-1].tok)->stage) {
        return;
      }
      emitOp(this,pRVar4 + -1);
      pRVar4 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pEVar1 = this->emit;
      if (pRVar4[-1].paren == true) {
        (*pEVar1->_vptr_EmitXml[0x1b])(pEVar1,0x29);
      }
      else {
        (*pEVar1->_vptr_EmitXml[0x1d])(pEVar1,(ulong)(uint)pRVar4[-1].id);
      }
      pRVar2 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->revpol).
      super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
    } while (pRVar2 != pRVar4);
    return;
  }
  emitAtom(this,atom);
  return;
}

Assistant:

void PrintLanguage::pushAtom(const Atom &atom)

{
  if (pending < nodepend.size()) // pending varnodes before atom
    recurse();			// So we must recurse

  if (revpol.empty())
    emitAtom(atom);
  else {
    emitOp(revpol.back());
    emitAtom(atom);
    do {
      revpol.back().visited += 1;
      if (revpol.back().visited == revpol.back().tok->stage) {
	emitOp(revpol.back());
	if (revpol.back().paren)
	  emit->closeParen(')',revpol.back().id);
	else
	  emit->closeGroup(revpol.back().id);
	revpol.pop_back();
      }
      else
	break;
    } while(!revpol.empty());
  }
}